

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

IPStatsRecord * __thiscall
BinHash<IPStatsRecord>::InsertOrAdd
          (BinHash<IPStatsRecord> *this,IPStatsRecord *key,bool need_alloc,bool *stored)

{
  int iVar1;
  uint local_38;
  uint newSize;
  uint newCount;
  IPStatsRecord *retKey;
  bool *stored_local;
  bool need_alloc_local;
  IPStatsRecord *key_local;
  BinHash<IPStatsRecord> *this_local;
  
  _newSize = (IPStatsRecord *)0x0;
  iVar1 = this->tableCount + 1;
  if (key != (IPStatsRecord *)0x0) {
    if (this->tableSize < (uint)(iVar1 * 2)) {
      local_38 = this->tableSize;
      if (this->tableSize == 0) {
        local_38 = 0x80;
      }
      for (; local_38 < (uint)(iVar1 * 4); local_38 = local_38 << 1) {
      }
      Resize(this,local_38);
    }
    _newSize = DoInsert(this,key,need_alloc,stored);
  }
  return _newSize;
}

Assistant:

KeyObj * InsertOrAdd(KeyObj * key, bool need_alloc, bool* stored)
    {
        KeyObj * retKey = NULL;
        unsigned int newCount = tableCount + 1;

        if (key != NULL)
        {
            if (tableSize < 2 * newCount)
            {
                unsigned int newSize = tableSize;

                if (tableSize == 0)
                {
                    newSize = 128;
                }

                while (newSize < 4 * newCount)
                {
                    newSize *= 2;
                }

                Resize(newSize);
            }

            retKey = DoInsert(key, need_alloc, stored);
        }

        return retKey;
    }